

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_recon.c
# Opt level: O2

REF_STATUS
ref_recon_extrapolate_zeroth(REF_GRID ref_grid,REF_DBL *recon,REF_BOOL *replace,REF_INT ldim)

{
  long lVar1;
  REF_NODE pRVar2;
  REF_ADJ pRVar3;
  int iVar4;
  uint uVar5;
  long lVar6;
  undefined8 uVar7;
  long lVar8;
  REF_BOOL *pRVar9;
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  int iVar13;
  char *pcVar14;
  int iVar15;
  REF_ADJ_ITEM pRVar16;
  ulong uVar17;
  double dVar18;
  REF_INT remain;
  REF_NODE local_78;
  REF_GRID local_70;
  REF_EDGE ref_edge;
  ulong local_60;
  long local_58;
  long local_50;
  ulong local_48;
  long local_40;
  long local_38;
  
  pRVar2 = ref_grid->node;
  uVar5 = ref_edge_create(&ref_edge,ref_grid);
  if (uVar5 == 0) {
    uVar5 = ref_node_ghost_int(pRVar2,replace,ldim);
    if (uVar5 == 0) {
      uVar5 = ref_node_ghost_dbl(pRVar2,recon,ldim);
      if (uVar5 == 0) {
        remain = 1;
        uVar12 = 0;
        uVar17 = 0;
        if (0 < ldim) {
          uVar17 = (ulong)(uint)ldim;
        }
        local_58 = (long)ldim;
        local_50 = local_58 * 4;
        local_78 = pRVar2;
        local_70 = ref_grid;
        local_48 = uVar17;
        do {
          pRVar2 = local_78;
          if ((int)uVar12 == 10) break;
          for (lVar6 = 0; lVar6 < local_78->max; lVar6 = lVar6 + 1) {
            if ((-1 < local_78->global[lVar6]) && (local_78->ref_mpi->id == local_78->part[lVar6]))
            {
              local_38 = lVar6 * local_58;
              for (uVar11 = 0; uVar11 != uVar17; uVar11 = uVar11 + 1) {
                lVar1 = uVar11 + local_38;
                if (replace[lVar1] != 0) {
                  pRVar3 = ref_edge->adj;
                  local_40 = (long)pRVar3->nnode;
                  uVar17 = 0xffffffff;
                  iVar10 = -1;
                  if (lVar6 < local_40) {
                    uVar5 = pRVar3->first[lVar6];
                    uVar17 = 0xffffffff;
                    iVar10 = -1;
                    if ((long)(int)uVar5 != -1) {
                      iVar10 = pRVar3->item[(int)uVar5].ref;
                      uVar17 = (ulong)uVar5;
                    }
                  }
                  iVar13 = 0;
                  while( true ) {
                    if ((int)uVar17 == -1) break;
                    iVar13 = iVar13 + (uint)(replace[uVar11 + (long)(((ref_edge->e2n[iVar10 * 2] -
                                                                      (int)lVar6) +
                                                                     ref_edge->e2n[iVar10 * 2 + 1])
                                                                    * ldim)] == 0);
                    uVar17 = (ulong)pRVar3->item[(int)uVar17].next;
                    iVar10 = -1;
                    if (uVar17 != 0xffffffffffffffff) {
                      iVar10 = pRVar3->item[uVar17].ref;
                    }
                  }
                  uVar17 = local_48;
                  if (iVar13 != 0) {
                    recon[lVar1] = 0.0;
                    dVar18 = 0.0;
                    iVar10 = -1;
                    iVar4 = iVar10;
                    if (local_40 <= lVar6) goto LAB_001bcdbd;
                    iVar15 = pRVar3->first[lVar6];
                    if (iVar15 == -1) goto LAB_001bcdbd;
                    pRVar16 = pRVar3->item;
                    do {
                      iVar10 = pRVar16[iVar15].ref;
                      iVar4 = iVar15;
LAB_001bcdbd:
                      iVar15 = iVar4;
                      uVar5 = iVar10 * 2;
                      do {
                        if (iVar15 == -1) {
                          recon[lVar1] = dVar18 / (double)iVar13;
                          replace[lVar1] = 0;
                          goto LAB_001bce30;
                        }
                        lVar8 = (long)(((ref_edge->e2n[(int)uVar5] - (int)lVar6) +
                                       ref_edge->e2n[(int)(uVar5 | 1)]) * ldim) + uVar11;
                        if (replace[lVar8] == 0) {
                          dVar18 = dVar18 + recon[lVar8];
                          recon[lVar1] = dVar18;
                        }
                        pRVar16 = pRVar3->item;
                        iVar15 = pRVar16[iVar15].next;
                        uVar5 = 0xfffffffe;
                      } while (iVar15 == -1);
                    } while( true );
                  }
                }
LAB_001bce30:
              }
            }
          }
          local_60 = uVar12;
          uVar5 = ref_node_ghost_int(local_78,replace,ldim);
          if (uVar5 != 0) {
            uVar7 = 0x462;
LAB_001bcfa1:
            pcVar14 = "update ghosts";
            goto LAB_001bcc1a;
          }
          uVar5 = ref_node_ghost_dbl(pRVar2,recon,ldim);
          if (uVar5 != 0) {
            uVar7 = 0x463;
            goto LAB_001bcfa1;
          }
          remain = 0;
          iVar10 = 0;
          pRVar9 = replace;
          for (lVar6 = 0; lVar6 < pRVar2->max; lVar6 = lVar6 + 1) {
            if ((-1 < local_78->global[lVar6]) && (local_78->ref_mpi->id == local_78->part[lVar6]))
            {
              for (uVar12 = 0; uVar17 != uVar12; uVar12 = uVar12 + 1) {
                if (pRVar9[uVar12] != 0) {
                  iVar10 = iVar10 + 1;
                  remain = iVar10;
                }
              }
            }
            pRVar9 = (REF_BOOL *)((long)pRVar9 + local_50);
          }
          uVar5 = ref_mpi_allsum(local_70->mpi,&remain,1,1);
          if (uVar5 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                   ,0x46d,"ref_recon_extrapolate_zeroth",(ulong)uVar5,"sum updates");
            return uVar5;
          }
          uVar12 = (ulong)((int)local_60 + 1);
        } while (remain != 0);
        ref_edge_free(ref_edge);
        if (remain < 1) {
          return 0;
        }
        if (local_70->mpi->id != 0) {
          return 0;
        }
        printf(" %d remain\n");
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",
               0x476,"ref_recon_extrapolate_zeroth","untouched boundary nodes remain");
        return 0;
      }
      pcVar14 = "update ghosts";
      uVar7 = 0x442;
    }
    else {
      pcVar14 = "update ghosts";
      uVar7 = 0x441;
    }
  }
  else {
    pcVar14 = "edges";
    uVar7 = 0x43f;
  }
LAB_001bcc1a:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",uVar7,
         "ref_recon_extrapolate_zeroth",(ulong)uVar5,pcVar14);
  return uVar5;
}

Assistant:

REF_FCN REF_STATUS ref_recon_extrapolate_zeroth(REF_GRID ref_grid,
                                                REF_DBL *recon,
                                                REF_BOOL *replace,
                                                REF_INT ldim) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT node, item, edge;
  REF_EDGE ref_edge;
  REF_INT i, neighbor, nint;
  REF_INT pass, remain;

  RSS(ref_edge_create(&ref_edge, ref_grid), "edges");

  RSS(ref_node_ghost_int(ref_node, replace, ldim), "update ghosts");
  RSS(ref_node_ghost_dbl(ref_node, recon, ldim), "update ghosts");

  remain = 1;
  for (pass = 0; pass < 10; pass++) {
    each_ref_node_valid_node(ref_node, node) {
      if (ref_node_owned(ref_node, node)) {
        for (i = 0; i < ldim; i++) {
          if (replace[i + ldim * node]) {
            nint = 0;
            each_edge_having_node(ref_edge, node, item, edge) {
              neighbor = ref_edge_e2n(ref_edge, 0, edge) +
                         ref_edge_e2n(ref_edge, 1, edge) - node;
              if (!replace[i + ldim * neighbor]) nint++;
            }
            if (0 < nint) {
              recon[i + ldim * node] = 0.0;
              each_edge_having_node(ref_edge, node, item, edge) {
                neighbor = ref_edge_e2n(ref_edge, 0, edge) +
                           ref_edge_e2n(ref_edge, 1, edge) - node;
                if (!replace[i + ldim * neighbor]) {
                  recon[i + ldim * node] += recon[i + ldim * neighbor];
                }
              }
              /* use Euclidean average, these are derivatives */
              recon[i + ldim * node] /= (REF_DBL)nint;
              replace[i + ldim * node] = REF_FALSE;
            }
          }
        }
      }
    }

    RSS(ref_node_ghost_int(ref_node, replace, ldim), "update ghosts");
    RSS(ref_node_ghost_dbl(ref_node, recon, ldim), "update ghosts");
    remain = 0;
    each_ref_node_valid_node(ref_node, node) {
      if (ref_node_owned(ref_node, node)) {
        for (i = 0; i < ldim; i++) {
          if (replace[i + ldim * node]) remain++;
        }
      }
    }
    RSS(ref_mpi_allsum(ref_grid_mpi(ref_grid), &remain, 1, REF_INT_TYPE),
        "sum updates");

    if (0 == remain) break;
  }

  ref_edge_free(ref_edge);

  if (0 < remain && ref_mpi_once(ref_grid_mpi(ref_grid))) {
    printf(" %d remain\n", remain);
    REF_WHERE("untouched boundary nodes remain");
  }

  return REF_SUCCESS;
}